

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O3

laszip_I32 laszip_remove_vlr(laszip_POINTER pointer,laszip_CHAR *user_id,laszip_U16 record_id)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  if (pointer == (laszip_POINTER)0x0) {
    return 1;
  }
  if (user_id == (laszip_CHAR *)0x0) {
    builtin_strncpy((char *)((long)pointer + 600),"ter \'use",8);
    builtin_strncpy((char *)((long)pointer + 0x260),"r_id\' is",8);
    builtin_strncpy((char *)((long)pointer + 0x248),"laszip_C",8);
    builtin_strncpy((char *)((long)pointer + 0x250),"HAR poin",8);
    *(undefined8 *)((long)pointer + 0x266) = 0x6f72657a207369;
    return 1;
  }
  if (*(long *)((long)pointer + 0x228) == 0) {
    if (*(long *)((long)pointer + 0x238) == 0) {
      lVar15 = *(long *)((long)pointer + 0x188);
      if (lVar15 == 0) {
        snprintf((char *)((long)pointer + 0x248),0x400,
                 "cannot remove VLR with user_id \'%s\' and record_id %d because header has no VLRs"
                 ,user_id,(ulong)record_id);
        return 1;
      }
      uVar4 = *(uint *)((long)pointer + 0x60);
      if ((ulong)uVar4 != 0) {
        uVar12 = uVar4 - 1;
        lVar17 = 0;
        uVar16 = 0;
        do {
          iVar13 = strncmp((char *)(lVar15 + lVar17 + 2),user_id,0x10);
          if ((iVar13 == 0) && (*(laszip_U16 *)(lVar15 + 0x12 + lVar17) == record_id)) {
            uVar3 = *(ushort *)(lVar15 + 0x14 + lVar17);
            if (uVar3 != 0) {
              *(uint *)((long)pointer + 0x5c) =
                   (*(int *)((long)pointer + 0x5c) - (uint)uVar3) + -0x36;
              pvVar14 = *(void **)(lVar15 + 0x38 + lVar17);
              if (pvVar14 != (void *)0x0) {
                operator_delete__(pvVar14);
                lVar15 = *(long *)((long)pointer + 0x188);
                uVar12 = *(int *)((long)pointer + 0x60) - 1;
              }
              *(undefined8 *)(lVar15 + 0x38 + lVar17) = 0;
            }
            *(uint *)((long)pointer + 0x60) = uVar12;
            if ((uint)uVar16 < uVar12) {
              do {
                lVar17 = lVar17 + 0x40;
                lVar15 = *(long *)((long)pointer + 0x188);
                uVar16 = uVar16 + 1;
                uVar5 = *(undefined8 *)(lVar15 + lVar17);
                uVar6 = ((undefined8 *)(lVar15 + lVar17))[1];
                puVar1 = (undefined8 *)(lVar15 + 0x10 + lVar17);
                uVar7 = *puVar1;
                uVar8 = puVar1[1];
                puVar1 = (undefined8 *)(lVar15 + 0x20 + lVar17);
                uVar9 = *puVar1;
                uVar10 = puVar1[1];
                puVar1 = (undefined8 *)(lVar15 + 0x30 + lVar17);
                uVar11 = puVar1[1];
                puVar2 = (undefined8 *)(lVar15 + -0x10 + lVar17);
                *puVar2 = *puVar1;
                puVar2[1] = uVar11;
                puVar1 = (undefined8 *)(lVar15 + -0x20 + lVar17);
                *puVar1 = uVar9;
                puVar1[1] = uVar10;
                puVar1 = (undefined8 *)(lVar15 + -0x30 + lVar17);
                *puVar1 = uVar7;
                puVar1[1] = uVar8;
                puVar1 = (undefined8 *)(lVar15 + -0x40 + lVar17);
                *puVar1 = uVar5;
                puVar1[1] = uVar6;
                uVar12 = *(uint *)((long)pointer + 0x60);
              } while (uVar16 < uVar12);
            }
            if (uVar12 == 0) {
              free(*(void **)((long)pointer + 0x188));
              *(undefined8 *)((long)pointer + 0x188) = 0;
            }
            else {
              pvVar14 = realloc_las(*(void **)((long)pointer + 0x188),(ulong)uVar12 << 6);
              *(void **)((long)pointer + 0x188) = pvVar14;
              if (pvVar14 == (void *)0x0) {
                snprintf((char *)((long)pointer + 0x248),0x400,"reallocating vlrs[%u] array",
                         (ulong)*(uint *)((long)pointer + 0x60));
                return 1;
              }
            }
            goto LAB_0014253b;
          }
          uVar16 = uVar16 + 1;
          lVar17 = lVar17 + 0x40;
        } while ((ulong)uVar4 << 6 != lVar17);
        if (uVar4 == 0xffffffff) {
LAB_0014253b:
          *(undefined1 *)((long)pointer + 0x248) = 0;
          return 0;
        }
      }
      snprintf((char *)((long)pointer + 0x248),0x400,
               "cannot find VLR with user_id \'%s\' and record_id %d among the %u VLRs in the header"
               ,user_id,(ulong)record_id);
      return 1;
    }
    builtin_strncpy((char *)((long)pointer + 0x262),"iter was",8);
    builtin_strncpy((char *)((long)pointer + 0x26a)," opened",8);
    builtin_strncpy((char *)((long)pointer + 600),"r after ",8);
    builtin_strncpy((char *)((long)pointer + 0x260),"writer w",8);
  }
  else {
    builtin_strncpy((char *)((long)pointer + 0x262),"ader was",8);
    builtin_strncpy((char *)((long)pointer + 0x26a)," opened",8);
    builtin_strncpy((char *)((long)pointer + 600),"r after ",8);
    builtin_strncpy((char *)((long)pointer + 0x260),"reader w",8);
  }
  builtin_strncpy((char *)((long)pointer + 0x248),"cann",4);
  builtin_strncpy((char *)((long)pointer + 0x24c),"ot r",4);
  builtin_strncpy((char *)((long)pointer + 0x250),"emov",4);
  builtin_strncpy((char *)((long)pointer + 0x254),"e vl",4);
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_remove_vlr(
    laszip_POINTER                     pointer
    , const laszip_CHAR*               user_id
    , laszip_U16                       record_id
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (user_id == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_CHAR pointer 'user_id' is zero");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot remove vlr after reader was opened");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot remove vlr after writer was opened");
      return 1;
    }

    U32 i = 0;

    if (laszip_dll->header.vlrs)
    {
      for (i = 0; i < laszip_dll->header.number_of_variable_length_records; i++)
      {
        if ((strncmp(laszip_dll->header.vlrs[i].user_id, user_id, 16) == 0) && (laszip_dll->header.vlrs[i].record_id == record_id))
        {
          if (laszip_dll->header.vlrs[i].record_length_after_header)
          {
            laszip_dll->header.offset_to_point_data -= (54 + laszip_dll->header.vlrs[i].record_length_after_header);
            delete [] laszip_dll->header.vlrs[i].data;
            laszip_dll->header.vlrs[i].data = 0;
          }
          laszip_dll->header.number_of_variable_length_records--;
          for (/*i = i*/; i < laszip_dll->header.number_of_variable_length_records; i++)
          {
            laszip_dll->header.vlrs[i] = laszip_dll->header.vlrs[i+1];
          }
          if (laszip_dll->header.number_of_variable_length_records)
          {
            laszip_dll->header.vlrs = (laszip_vlr_struct*)realloc_las(laszip_dll->header.vlrs, sizeof(laszip_vlr_struct)*laszip_dll->header.number_of_variable_length_records);
            if (laszip_dll->header.vlrs == 0)
            {
              snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reallocating vlrs[%u] array", laszip_dll->header.number_of_variable_length_records);
              return 1;
            }
          }
          else
          {
            free(laszip_dll->header.vlrs);
            laszip_dll->header.vlrs = 0;
          }
          i = U32_MAX;
          break;
        }
      }
      if (i != U32_MAX)
      {
        snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot find VLR with user_id '%s' and record_id %d among the %u VLRs in the header", user_id, (I32)record_id, laszip_dll->header.number_of_variable_length_records);
        return 1;
      }
    }
    else
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot remove VLR with user_id '%s' and record_id %d because header has no VLRs", user_id, (I32)record_id);
      return 1;
    }
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_add_vlr");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}